

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerSafe::PanIdQuery
          (CommissionerSafe *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint16_t aPanId,
          string *aDstAddr)

{
  pointer pcVar1;
  _func_void *p_Var2;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  CommissionerSafe *local_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  uint32_t local_58;
  uint16_t local_54;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_80 = this;
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_78,aHandler);
  pcVar1 = (aDstAddr->_M_dataplus)._M_p;
  local_58 = aChannelMask;
  local_54 = aPanId;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + aDstAddr->_M_string_length);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  p_Var2 = (_func_void *)operator_new(0x50);
  *(CommissionerSafe **)p_Var2 = local_80;
  *(undefined8 *)(p_Var2 + 8) = 0;
  *(undefined8 *)(p_Var2 + 0x10) = 0;
  *(undefined8 *)(p_Var2 + 0x18) = 0;
  *(undefined8 *)(p_Var2 + 0x20) = uStack_60;
  if (local_68 != (code *)0x0) {
    *(void **)(p_Var2 + 8) = local_78._M_unused._M_object;
    *(undefined8 *)(p_Var2 + 0x10) = local_78._8_8_;
    *(code **)(p_Var2 + 0x18) = local_68;
    local_68 = (code *)0x0;
    uStack_60 = 0;
  }
  *(uint16_t *)(p_Var2 + 0x2c) = local_54;
  *(uint32_t *)(p_Var2 + 0x28) = local_58;
  *(_func_void **)(p_Var2 + 0x30) = p_Var2 + 0x40;
  std::__cxx11::string::_M_construct<char*>((string *)(p_Var2 + 0x30),local_50,local_50 + local_48);
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:490:22)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:490:22)>
             ::_M_manager;
  local_a8._M_unused._0_8_ = (undefined8)p_Var2;
  PushAsyncRequest(this,(AsyncRequest *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerSafe::PanIdQuery(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint16_t           aPanId,
                                  const std::string &aDstAddr)
{
    PushAsyncRequest([=]() { mImpl->PanIdQuery(aHandler, aChannelMask, aPanId, aDstAddr); });
}